

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O3

EnumValueSymbol * __thiscall
slang::ast::EnumValueSymbol::fromSyntax
          (EnumValueSymbol *this,Compilation *compilation,DeclaratorSyntax *syntax,Type *type,
          optional<int> index)

{
  EnumValueSymbol *pEVar1;
  _Storage<int,_true> index_00;
  string_view name;
  string_view local_40;
  SourceLocation local_30;
  
  index_00._M_value =
       index.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
       _M_payload;
  local_40 = parsing::Token::valueText((Token *)&compilation->options);
  name._M_len = local_40._M_str;
  if (((ulong)type >> 0x20 & 1) != 0) {
    name._M_str = (char *)((ulong)type & 0xffffffff);
    local_40 = getEnumValueName((ast *)this,(Compilation *)local_40._M_len,name,index_00._M_value);
  }
  local_30 = parsing::Token::location((Token *)&compilation->options);
  pEVar1 = BumpAllocator::
           emplace<slang::ast::EnumValueSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation>
                     ((BumpAllocator *)this,&local_40,&local_30);
  (pEVar1->super_ValueSymbol).declaredType.type = (Type *)syntax;
  (pEVar1->super_ValueSymbol).super_Symbol.originatingSyntax = (SyntaxNode *)compilation;
  return pEVar1;
}

Assistant:

EnumValueSymbol& EnumValueSymbol::fromSyntax(Compilation& compilation,
                                             const DeclaratorSyntax& syntax, const Type& type,
                                             std::optional<int32_t> index) {
    string_view name = syntax.name.valueText();
    if (index)
        name = getEnumValueName(compilation, name, *index);

    auto ev = compilation.emplace<EnumValueSymbol>(name, syntax.name.location());
    ev->setType(type);
    ev->setSyntax(syntax);
    return *ev;
}